

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O0

void __thiscall ExecutorX86::Stop(ExecutorX86 *this,char *error)

{
  char *error_local;
  ExecutorX86 *this_local;
  
  this->codeRunning = false;
  this->callContinue = false;
  NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"%s",error);
  this->execErrorMessage = this->execErrorBuffer;
  (this->execErrorObject).typeID = 0;
  (this->execErrorObject).ptr = (char *)0x0;
  return;
}

Assistant:

void ExecutorX86::Stop(const char* error)
{
	codeRunning = false;

	callContinue = false;

	NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "%s", error);

	execErrorMessage = execErrorBuffer;

	execErrorObject.typeID = 0;
	execErrorObject.ptr = NULL;
}